

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_null_istream<char>::basic_null_istream(basic_null_istream<char> *this)

{
  std::ios::ios((ios *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x50);
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream =
       (_func_int **)0x997280;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x50 = 0x9972a8;
  std::istream::istream(this,(streambuf *)&PTR_construction_vtable_24__009972c0);
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream =
       (_func_int **)0x997280;
  *(undefined8 *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x50 = 0x9972a8;
  null_buffer::null_buffer
            ((null_buffer *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x10);
  return;
}

Assistant:

basic_null_istream()
          : std::basic_istream<CharT>(&nb_)
        {
        }